

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void MergeRGBRow_SSSE3(uint8_t *src_r,uint8_t *src_g,uint8_t *src_b,uint8_t *dst_rgb,int width)

{
  bool bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  do {
    auVar3 = pshufb(*(undefined1 (*) [16])src_r,(undefined1  [16])libyuv::kShuffleMaskRToRGB0);
    auVar4 = pshufb(*(undefined1 (*) [16])src_g,(undefined1  [16])libyuv::kShuffleMaskGToRGB0);
    auVar5 = pshufb(*(undefined1 (*) [16])src_b,(undefined1  [16])libyuv::kShuffleMaskBToRGB0);
    *(undefined1 (*) [16])dst_rgb = auVar3 | auVar4 | auVar5;
    auVar3 = pshufb(*(undefined1 (*) [16])src_r,(undefined1  [16])libyuv::kShuffleMaskRToRGB1);
    auVar4 = pshufb(*(undefined1 (*) [16])src_g,(undefined1  [16])libyuv::kShuffleMaskGToRGB1);
    auVar5 = pshufb(*(undefined1 (*) [16])src_b,(undefined1  [16])libyuv::kShuffleMaskBToRGB1);
    *(undefined1 (*) [16])((long)dst_rgb + 0x10) = auVar3 | auVar4 | auVar5;
    auVar3 = pshufb(*(undefined1 (*) [16])src_r,(undefined1  [16])libyuv::kShuffleMaskRToRGB2);
    auVar4 = pshufb(*(undefined1 (*) [16])src_g,(undefined1  [16])libyuv::kShuffleMaskGToRGB2);
    auVar5 = pshufb(*(undefined1 (*) [16])src_b,(undefined1  [16])libyuv::kShuffleMaskBToRGB2);
    *(undefined1 (*) [16])((long)dst_rgb + 0x20) = auVar3 | auVar4 | auVar5;
    src_r = (uint8_t *)((long)src_r + 0x10);
    src_g = (uint8_t *)((long)src_g + 0x10);
    src_b = (uint8_t *)((long)src_b + 0x10);
    dst_rgb = (uint8_t *)((long)dst_rgb + 0x30);
    iVar2 = width + -0x10;
    bVar1 = 0xf < width;
    width = iVar2;
  } while (iVar2 != 0 && bVar1);
  return;
}

Assistant:

void MergeRGBRow_SSSE3(const uint8_t* src_r,
                       const uint8_t* src_g,
                       const uint8_t* src_b,
                       uint8_t* dst_rgb,
                       int width) {
  asm volatile(

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      (%1),%%xmm1                   \n"
      "movdqu      (%2),%%xmm2                   \n"
      "pshufb      %5, %%xmm0                    \n"
      "pshufb      %6, %%xmm1                    \n"
      "pshufb      %7, %%xmm2                    \n"
      "por         %%xmm1,%%xmm0                 \n"
      "por         %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,(%3)                   \n"

      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      (%1),%%xmm1                   \n"
      "movdqu      (%2),%%xmm2                   \n"
      "pshufb      %8, %%xmm0                    \n"
      "pshufb      %9, %%xmm1                    \n"
      "pshufb      %10, %%xmm2                   \n"
      "por         %%xmm1,%%xmm0                 \n"
      "por         %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,16(%3)                 \n"

      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      (%1),%%xmm1                   \n"
      "movdqu      (%2),%%xmm2                   \n"
      "pshufb      %11, %%xmm0                   \n"
      "pshufb      %12, %%xmm1                   \n"
      "pshufb      %13, %%xmm2                   \n"
      "por         %%xmm1,%%xmm0                 \n"
      "por         %%xmm2,%%xmm0                 \n"
      "movdqu      %%xmm0,32(%3)                 \n"

      "lea         0x10(%0),%0                   \n"
      "lea         0x10(%1),%1                   \n"
      "lea         0x10(%2),%2                   \n"
      "lea         0x30(%3),%3                   \n"
      "sub         $0x10,%4                      \n"
      "jg          1b                            \n"
      : "+r"(src_r),               // %0
        "+r"(src_g),               // %1
        "+r"(src_b),               // %2
        "+r"(dst_rgb),             // %3
        "+r"(width)                // %4
      : "m"(kShuffleMaskRToRGB0),  // %5
        "m"(kShuffleMaskGToRGB0),  // %6
        "m"(kShuffleMaskBToRGB0),  // %7
        "m"(kShuffleMaskRToRGB1),  // %8
        "m"(kShuffleMaskGToRGB1),  // %9
        "m"(kShuffleMaskBToRGB1),  // %10
        "m"(kShuffleMaskRToRGB2),  // %11
        "m"(kShuffleMaskGToRGB2),  // %12
        "m"(kShuffleMaskBToRGB2)   // %13
      : "memory", "cc", "xmm0", "xmm1", "xmm2");
}